

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

symbol * restricted_binop_type
                   (dmr_C *C,int op,expression *left,expression *right,int lclass,int rclass,
                   symbol *ltype,symbol *rtype)

{
  int iVar1;
  symbol *psVar2;
  symbol *local_38;
  symbol *ctype;
  int rclass_local;
  int lclass_local;
  expression *right_local;
  expression *left_local;
  int op_local;
  dmr_C *C_local;
  
  local_38 = (symbol *)0x0;
  if ((lclass & 4U) == 0) {
    iVar1 = restricted_value(left,rtype);
    if (iVar1 == 0) {
      local_38 = rtype;
    }
  }
  else if ((rclass & 4U) == 0) {
    iVar1 = restricted_value(right,ltype);
    if (iVar1 == 0) {
      local_38 = ltype;
    }
  }
  else if (ltype == rtype) {
    local_38 = ltype;
  }
  else if ((lclass & 0x40U) == 0) {
    if (((rclass & 0x40U) != 0) && (psVar2 = unfoul(rtype), psVar2 == ltype)) {
      local_38 = rtype;
    }
  }
  else {
    psVar2 = unfoul(ltype);
    if (psVar2 == rtype) {
      local_38 = ltype;
    }
  }
  if (local_38 == (symbol *)0x0) {
    return (symbol *)0x0;
  }
  iVar1 = restricted_binop(op);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      if (((lclass ^ rclass) & 0x40U) == 0) {
        return local_38;
      }
      psVar2 = unfoul(local_38);
      return psVar2;
    }
    if (iVar1 != 3) {
      return local_38;
    }
    if ((lclass & rclass & 0x40U) == 0) {
      return local_38;
    }
  }
  return (symbol *)0x0;
}

Assistant:

static struct symbol *restricted_binop_type(struct dmr_C *C, int op,
					struct expression *left,
					struct expression *right,
					int lclass, int rclass,
					struct symbol *ltype,
					struct symbol *rtype)
{
        (void) C;
	struct symbol *ctype = NULL;
	if (lclass & TYPE_RESTRICT) {
		if (rclass & TYPE_RESTRICT) {
			if (ltype == rtype) {
				ctype = ltype;
			} else if (lclass & TYPE_FOULED) {
				if (unfoul(ltype) == rtype)
					ctype = ltype;
			} else if (rclass & TYPE_FOULED) {
				if (unfoul(rtype) == ltype)
					ctype = rtype;
			}
		} else {
			if (!restricted_value(right, ltype))
				ctype = ltype;
		}
	} else if (!restricted_value(left, rtype))
		ctype = rtype;

	if (ctype) {
		switch (restricted_binop(op)) {
		case 1:
			if ((lclass ^ rclass) & TYPE_FOULED)
				ctype = unfoul(ctype);
			break;
		case 3:
			if (!(lclass & rclass & TYPE_FOULED))
				break;
		case 0:
			ctype = NULL;
		default:
			break;
		}
	}

	return ctype;
}